

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O0

errno_t memset_s(void *s,rsize_t smax,int c,rsize_t n)

{
  undefined1 *local_38;
  uchar *p;
  rsize_t n_local;
  int c_local;
  rsize_t smax_local;
  void *s_local;
  
  if ((((s == (void *)0x0) || (0x7fffffffffffffff < smax)) || (0x7fffffffffffffff < n)) ||
     (local_38 = (undefined1 *)s, p = (uchar *)n, smax < n)) {
    if ((s != (void *)0x0) && (smax < 0x8000000000000000)) {
      memset(s,c & 0xff,smax);
    }
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    s_local._4_4_ = 0x16;
  }
  else {
    while (p != (uchar *)0x0) {
      *local_38 = (char)c;
      local_38 = local_38 + 1;
      p = p + -1;
    }
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

errno_t memset_s( void * s, rsize_t smax, int c, rsize_t n )
{
    unsigned char * p = ( unsigned char * ) s;

    if ( s == NULL || smax > RSIZE_MAX || n > RSIZE_MAX || n > smax )
    {
        if ( s != NULL && smax <= RSIZE_MAX )
        {
            memset( s, c, smax );
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    while ( n-- )
    {
        *p++ = ( unsigned char ) c;
    }

    return 0;
}